

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EfcFlash.cpp
# Opt level: O3

void __thiscall EfcFlash::writePage(EfcFlash *this,uint32_t page)

{
  WordCopyApplet *this_00;
  bool *pbVar1;
  bool bVar2;
  uint uVar3;
  undefined8 *puVar4;
  uint uVar5;
  uint32_t addr;
  
  if (page < (this->super_Flash)._pages) {
    this_00 = &(this->super_Flash)._wordCopy;
    WordCopyApplet::setDstAddr(this_00,(this->super_Flash)._size * page + (this->super_Flash)._addr)
    ;
    WordCopyApplet::setSrcAddr
              (this_00,(&(this->super_Flash)._pageBufferA)[(this->super_Flash)._onBufferA ^ 1]);
    pbVar1 = &(this->super_Flash)._onBufferA;
    *pbVar1 = (bool)(*pbVar1 ^ 1);
    waitFSR(this,1);
    Applet::run(&this_00->super_Applet);
    addr = 0xffffff64;
    if ((this->super_Flash)._planes == 2) {
      uVar3 = (this->super_Flash)._pages >> 1;
      bVar2 = uVar3 <= page;
      uVar5 = 0;
      if (uVar3 <= page) {
        uVar5 = uVar3;
      }
      page = page - uVar5;
      addr = (uint)bVar2 << 4 | 0xffffff64;
    }
    Samba::writeWord((this->super_Flash)._samba,addr,page << 8 | 0x5a000001);
    return;
  }
  puVar4 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar4 = &PTR__exception_001187a0;
  __cxa_throw(puVar4,&FlashPageError::typeinfo,std::exception::~exception);
}

Assistant:

void
EfcFlash::writePage(uint32_t page)
{
    if (page >= _pages)
        throw FlashPageError();

    _wordCopy.setDstAddr(_addr + page * _size);
    _wordCopy.setSrcAddr(_onBufferA ? _pageBufferA : _pageBufferB);
    _onBufferA = !_onBufferA;
    waitFSR();
    _wordCopy.run();
    if (_planes == 2 && page >= _pages / 2)
        writeFCR1(EFC_FCMD_WP, page - _pages / 2);
    else
        writeFCR0(EFC_FCMD_WP, page);
}